

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditBuildInfoTests.cpp
# Opt level: O3

IterateResult __thiscall dit::BuildInfoStringCase::iterate(BuildInfoStringCase *this)

{
  ostringstream *this_00;
  undefined1 local_190 [384];
  
  local_190._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->m_valueName)._M_dataplus._M_p,
             (this->m_valueName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," = ",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,(this->m_value)._M_dataplus._M_p,(this->m_value)._M_string_length);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x78));
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		m_testCtx.getLog() << TestLog::Message << m_valueName << " = " << m_value << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}